

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.h
# Opt level: O2

int s2pred::TriageSign(S2Point *a,S2Point *b,S2Point *c,Vector3_d *a_cross_b)

{
  bool bVar1;
  int iVar2;
  S2LogMessage SStack_48;
  double local_38;
  
  bVar1 = S2::IsUnitLength(a);
  if (bVar1) {
    bVar1 = S2::IsUnitLength(b);
    if (bVar1) {
      bVar1 = S2::IsUnitLength(c);
      if (bVar1) {
        local_38 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                             ((BasicVector<Vector3,_double,_3UL> *)a_cross_b,c);
        if (((FLAGS_s2debug == true) && (4.057643110400022e-16 < ABS(local_38))) &&
           (ABS(local_38) < 4.057643110400022e-14)) {
          iVar2 = ExpensiveSign(a,b,c,true);
          if ((double)iVar2 * local_38 <= 0.0) {
            S2LogMessage::S2LogMessage
                      (&SStack_48,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.h"
                       ,0x111,kFatal,(ostream *)&std::cerr);
            std::operator<<(SStack_48.stream_,
                            "Check failed: !FLAGS_s2debug || std::fabs(det) <= kMaxDetError || std::fabs(det) >= 100 * kMaxDetError || det * ExpensiveSign(a, b, c) > 0 "
                           );
            goto LAB_001df183;
          }
        }
        iVar2 = 1;
        if (local_38 <= 4.057643110400022e-16) {
          iVar2 = -(uint)(local_38 < -4.057643110400022e-16);
        }
        return iVar2;
      }
      S2LogMessage::S2LogMessage
                (&SStack_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.h"
                 ,0x10a,kFatal,(ostream *)&std::cerr);
      std::operator<<(SStack_48.stream_,"Check failed: S2::IsUnitLength(c) ");
    }
    else {
      S2LogMessage::S2LogMessage
                (&SStack_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.h"
                 ,0x109,kFatal,(ostream *)&std::cerr);
      std::operator<<(SStack_48.stream_,"Check failed: S2::IsUnitLength(b) ");
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.h"
               ,0x108,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_48.stream_,"Check failed: S2::IsUnitLength(a) ");
  }
LAB_001df183:
  abort();
}

Assistant:

inline int TriageSign(const S2Point& a, const S2Point& b,
                      const S2Point& c, const Vector3_d& a_cross_b) {
  // kMaxDetError is the maximum error in computing (AxB).C where all vectors
  // are unit length.  Using standard inequalities, it can be shown that
  //
  //  fl(AxB) = AxB + D where |D| <= (|AxB| + (2/sqrt(3))*|A|*|B|) * e
  //
  // where "fl()" denotes a calculation done in floating-point arithmetic,
  // |x| denotes either absolute value or the L2-norm as appropriate, and
  // e = 0.5*DBL_EPSILON.  Similarly,
  //
  //  fl(B.C) = B.C + d where |d| <= (1.5*|B.C| + 1.5*|B|*|C|) * e .
  //
  // Applying these bounds to the unit-length vectors A,B,C and neglecting
  // relative error (which does not affect the sign of the result), we get
  //
  //  fl((AxB).C) = (AxB).C + d where |d| <= (2.5 + 2/sqrt(3)) * e
  //
  // which is about 3.6548 * e, or 1.8274 * DBL_EPSILON.
  const double kMaxDetError = 1.8274 * DBL_EPSILON;
  S2_DCHECK(S2::IsUnitLength(a));
  S2_DCHECK(S2::IsUnitLength(b));
  S2_DCHECK(S2::IsUnitLength(c));
  double det = a_cross_b.DotProd(c);

  // Double-check borderline cases in debug mode.
  S2_DCHECK(!FLAGS_s2debug ||
         std::fabs(det) <= kMaxDetError ||
         std::fabs(det) >= 100 * kMaxDetError ||
         det * ExpensiveSign(a, b, c) > 0);

  if (det > kMaxDetError) return 1;
  if (det < -kMaxDetError) return -1;
  return 0;
}